

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_sse42.c
# Opt level: O0

uint32_t av1_get_crc32c_value_sse4_2(void *crc_calculator,uint8_t *p,size_t len)

{
  uint64_t crc64;
  uint32_t crc;
  uint8_t *buf;
  size_t len_local;
  uint8_t *p_local;
  void *crc_calculator_local;
  
  crc = 0xffffffff;
  buf = p;
  for (len_local = len; len_local != 0 && ((ulong)buf & 7) != 0; len_local = len_local - 1) {
    crc = crc32(crc,*buf);
    buf = buf + 1;
  }
  crc64 = (uint64_t)crc;
  for (; 7 < len_local; len_local = len_local - 8) {
    crc64 = crc32(crc64,*(undefined8 *)buf);
    buf = buf + 8;
  }
  crc = (uint32_t)crc64;
  for (; 3 < len_local; len_local = len_local - 4) {
    crc = crc32(crc,*(undefined4 *)buf);
    buf = buf + 4;
  }
  for (; 1 < len_local; len_local = len_local - 2) {
    crc = crc32(crc,*(undefined2 *)buf);
    buf = buf + 2;
  }
  for (; len_local != 0; len_local = len_local - 1) {
    crc = crc32(crc,*buf);
    buf = buf + 1;
  }
  return crc ^ 0xffffffff;
}

Assistant:

uint32_t av1_get_crc32c_value_sse4_2(void *crc_calculator, uint8_t *p,
                                     size_t len) {
  (void)crc_calculator;
  const uint8_t *buf = p;
  uint32_t crc = 0xFFFFFFFF;

  // Align the input to the word boundary
  for (; (len > 0) && ((intptr_t)buf & ALIGN_MASK); len--, buf++) {
    crc = _mm_crc32_u8(crc, *buf);
  }

#ifdef __x86_64__
  uint64_t crc64 = crc;
  CALC_CRC(_mm_crc32_u64, crc64, uint64_t, buf, len)
  crc = (uint32_t)crc64;
#endif
  CALC_CRC(_mm_crc32_u32, crc, uint32_t, buf, len)
  CALC_CRC(_mm_crc32_u16, crc, uint16_t, buf, len)
  CALC_CRC(_mm_crc32_u8, crc, uint8_t, buf, len)
  return (crc ^ 0xFFFFFFFF);
}